

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_Size_Init(FT_Size size)

{
  FT_Error FVar1;
  FT_Size pFStack_30;
  FT_Error error;
  FT_Size ttsize;
  T42_Face t42face;
  FT_Face face;
  T42_Size t42size;
  FT_Size size_local;
  
  ttsize = (FT_Size)size->face;
  t42face = (T42_Face)ttsize;
  face = (FT_Face)size;
  t42size = (T42_Size)size;
  FVar1 = FT_New_Size(((T42_Face)ttsize)->ttf_face,&stack0xffffffffffffffd0);
  (face->generic).data = pFStack_30;
  FT_Activate_Size(pFStack_30);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Size_Init( FT_Size  size )         /* T42_Size */
  {
    T42_Size  t42size = (T42_Size)size;
    FT_Face   face    = size->face;
    T42_Face  t42face = (T42_Face)face;
    FT_Size   ttsize;
    FT_Error  error;


    error = FT_New_Size( t42face->ttf_face, &ttsize );
    t42size->ttsize = ttsize;

    FT_Activate_Size( ttsize );

    return error;
  }